

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

float ncnn::get_value_bounded(Mat *image,int x,int y,int z)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  float local_e8;
  void *local_e0;
  int *local_d8;
  size_t local_d0;
  int local_c8;
  Allocator *local_c0;
  undefined4 local_b8;
  int local_b4;
  int local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  long local_a0;
  int local_94;
  int local_90;
  int local_8c;
  Mat *local_88;
  float local_7c;
  void **local_78;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  void *local_60;
  int local_54;
  void **local_50;
  int local_44;
  Mat *local_40;
  void **local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_94 = in_ECX;
  local_90 = in_EDX;
  local_8c = in_ESI;
  local_88 = in_RDI;
  bVar1 = in_bounds(in_RDI,in_ESI,in_EDX,in_ECX);
  if (bVar1) {
    local_38 = &local_e0;
    local_40 = local_88;
    local_44 = local_94;
    local_c = local_88->w;
    local_10 = local_88->h;
    local_18 = (void *)((long)local_88->data +
                       (long)local_88->w * (long)local_88->h * (long)local_94 * local_88->elemsize);
    local_20 = local_88->elemsize;
    local_24 = local_88->elempack;
    local_30 = local_88->allocator;
    local_8 = &local_e0;
    local_d8 = (int *)0x0;
    local_b8 = 2;
    local_ac = 1;
    local_a8 = 1;
    local_a0 = (long)local_c * (long)local_10;
    local_50 = &local_e0;
    local_54 = local_90;
    local_e8 = *(float *)((long)local_18 +
                         (long)local_8c * 4 + (long)local_c * (long)local_90 * local_20);
    local_e0 = local_18;
    local_d0 = local_20;
    local_c8 = local_24;
    local_c0 = local_30;
    local_b4 = local_c;
    local_b0 = local_10;
  }
  else {
    local_e8 = 0.0;
  }
  local_7c = local_e8;
  if ((bVar1) && (local_78 = &local_e0, local_d8 != (int *)0x0)) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_d8;
    *local_d8 = *local_d8 + -1;
    UNLOCK();
    if (local_70 == 1) {
      local_68 = local_78;
      if (local_c0 == (Allocator *)0x0) {
        local_60 = local_e0;
        if (local_e0 != (void *)0x0) {
          free(local_e0);
        }
      }
      else {
        (*local_c0->_vptr_Allocator[3])(local_c0,local_e0);
      }
    }
  }
  return local_7c;
}

Assistant:

static float get_value_bounded(const Mat& image, int x, int y, int z)
{
    return in_bounds(image, x, y, z) ? image.depth(z).row(y)[x] : 0.f;
}